

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O1

int GetLatestDataMT(MT *pMT,MTDATA *pMTData)

{
  uint uVar1;
  int iVar2;
  uint offset;
  long lVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  double dVar9;
  int nbdatabytes;
  uchar databuf [2048];
  double local_888;
  int local_86c;
  double local_868;
  ulong uStack_860;
  double local_858;
  double local_850;
  double local_848;
  double local_840;
  double local_838;
  uint local_828;
  ushort uStack_824;
  uchar auStack_822 [2050];
  
  local_86c = 0;
  if (pMT->bLegacyMode == 0) {
    iVar2 = GetLatestData2MT(pMT,pMTData);
    return iVar2;
  }
  memset(&local_828,0,0x800);
  local_86c = 0;
  iVar2 = GetLatestMTMessageMT(pMT,0xff,0x32,(uchar *)&local_828,0x800,&local_86c);
  if (iVar2 != 0) {
    return 1;
  }
  memset(pMTData,0,0x130);
  uVar1 = pMT->OutputMode;
  uVar4 = (int)(uVar1 << 0x11) >> 0x1f & 0x14;
  offset = uVar4 + 0x2c;
  if ((uVar1 >> 0xc & 1) == 0) {
    offset = uVar4;
  }
  if ((uVar1 & 1) != 0) {
    offset = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,offset,&pMTData->temp);
  }
  if ((pMT->OutputMode & 2) != 0) {
    if ((pMT->OutputSettings & 0x10U) == 0) {
      iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,offset,&pMTData->accX);
      iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->accY);
      offset = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->accZ);
    }
    if ((pMT->OutputSettings & 0x20U) == 0) {
      iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,offset,&pMTData->gyrX);
      iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->gyrY);
      offset = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->gyrZ);
    }
    if ((pMT->OutputSettings & 0x40U) == 0) {
      iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,offset,&pMTData->magX);
      iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->magY);
      offset = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->magZ);
    }
  }
  if ((pMT->OutputMode & 4) == 0) goto LAB_00110b80;
  uVar1 = pMT->OutputSettings;
  if ((uVar1 & 0xc) == 8) {
    iVar2 = ConvertToDoubleMT(uVar1,(uchar *)&local_828,offset,&pMTData->a);
    iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->b);
    iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->c);
    iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->d);
    iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->e);
    iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->f);
    iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->g);
    iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->h);
    offset = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->i);
    dVar5 = atan2(pMTData->f,pMTData->i);
    dVar7 = pMTData->c;
    dVar8 = -1.0;
    if ((-1.0 <= dVar7) && (dVar8 = 1.0, dVar7 <= 1.0)) {
      dVar8 = dVar7;
    }
    dVar7 = asin(dVar8);
    local_868 = -dVar7;
    uStack_860 = extraout_XMM0_Qb ^ 0x8000000000000000;
    local_888 = atan2(pMTData->b,pMTData->a);
    pMTData->roll = (dVar5 * 180.0) / 3.141592653589793;
LAB_00110a09:
    pMTData->pitch = (dVar7 * -180.0) / 3.141592653589793;
    pMTData->yaw = (local_888 * 180.0) / 3.141592653589793;
  }
  else {
    if ((uVar1 & 0xc) != 4) {
      iVar2 = ConvertToDoubleMT(uVar1,(uchar *)&local_828,offset,&pMTData->q0);
      iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->q1);
      iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->q2);
      offset = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->q3);
      dVar7 = pMTData->q0;
      dVar8 = pMTData->q1;
      dVar6 = pMTData->q2;
      local_858 = pMTData->q3;
      local_850 = dVar7 + dVar7;
      local_840 = dVar7 * dVar7 + dVar7 * dVar7;
      dVar5 = atan2((dVar6 + dVar6) * local_858 + local_850 * dVar8,
                    local_858 * local_858 + local_858 * local_858 + local_840 + -1.0);
      local_848 = dVar8 + dVar8;
      dVar9 = local_848 * local_858 - dVar6 * local_850;
      dVar7 = -1.0;
      if ((-1.0 <= dVar9) && (dVar7 = 1.0, dVar9 <= 1.0)) {
        dVar7 = dVar9;
      }
      local_838 = asin(dVar7);
      local_868 = -local_838;
      uStack_860 = extraout_XMM0_Qb_00 ^ 0x8000000000000000;
      local_888 = atan2(local_848 * dVar6 + local_850 * local_858,
                        local_840 + dVar8 * dVar8 + dVar8 * dVar8 + -1.0);
      pMTData->roll = (dVar5 * 180.0) / 3.141592653589793;
      dVar7 = local_838;
      goto LAB_00110a09;
    }
    iVar2 = ConvertToDoubleMT(uVar1,(uchar *)&local_828,offset,&pMTData->roll);
    iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->pitch);
    offset = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->yaw);
    dVar5 = (pMTData->roll * 3.141592653589793) / 180.0;
    local_868 = (pMTData->pitch * 3.141592653589793) / 180.0;
    uStack_860 = 0;
    local_888 = (pMTData->yaw * 3.141592653589793) / 180.0;
  }
  dVar7 = pMT->rollorientation;
  dVar8 = pMT->rollp1;
  dVar6 = cos(dVar5 + pMT->rollp2);
  dVar7 = fmod(dVar6 * dVar8 + dVar7 + dVar5,6.283185307179586);
  dVar7 = fmod(dVar7 + 9.42477796076938,6.283185307179586);
  pMTData->Roll = dVar7 + -3.141592653589793;
  dVar5 = pMT->pitchorientation + local_868;
  dVar7 = pMT->pitchp1;
  dVar8 = cos(local_868 + pMT->pitchp2);
  dVar7 = fmod(dVar8 * dVar7 + dVar5,6.283185307179586);
  dVar7 = fmod(dVar7 + 9.42477796076938,6.283185307179586);
  pMTData->Pitch = dVar7 + -3.141592653589793;
  local_868 = pMT->yaworientation + local_888;
  dVar7 = pMT->yawp1;
  dVar8 = cos(local_888 + pMT->yawp2);
  dVar7 = fmod(dVar8 * dVar7 + local_868,6.283185307179586);
  dVar7 = fmod(dVar7 + 9.42477796076938,6.283185307179586);
  pMTData->Yaw = dVar7 + -3.141592653589793;
LAB_00110b80:
  uVar1 = pMT->OutputMode;
  if ((uVar1 & 8) != 0) {
    uVar4 = pMT->OutputSettings;
    if ((uVar4 >> 10 & 1) == 0) {
      pMTData->Ain_1 =
           *(ushort *)((long)&local_828 + (long)(int)offset) << 8 |
           *(ushort *)((long)&local_828 + (long)(int)offset) >> 8;
      offset = offset + 2;
    }
    if ((uVar4 >> 0xb & 1) == 0) {
      pMTData->Ain_2 =
           *(ushort *)((long)&local_828 + (long)(int)offset) << 8 |
           *(ushort *)((long)&local_828 + (long)(int)offset) >> 8;
      offset = offset + 2;
    }
  }
  if ((uVar1 & 0x10) != 0) {
    iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,offset,&pMTData->Lat);
    iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->Long);
    offset = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->Alt);
  }
  if ((pMT->OutputMode & 0x20) != 0) {
    iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,offset,&pMTData->Vel_X);
    iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->Vel_Y);
    offset = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->Vel_Z);
  }
  if ((pMT->OutputMode & 0x800) != 0) {
    pMTData->Status = *(uchar *)((long)&local_828 + (long)(int)offset);
    offset = offset + 1;
  }
  uVar1 = pMT->OutputSettings;
  if ((uVar1 & 1) != 0) {
    pMTData->TS = *(ushort *)((long)&local_828 + (long)(int)offset) << 8 |
                  *(ushort *)((long)&local_828 + (long)(int)offset) >> 8;
    offset = offset + 2;
  }
  if ((uVar1 & 2) != 0) {
    lVar3 = (long)(int)offset;
    uVar1 = *(uint *)((long)&local_828 + lVar3);
    (pMTData->UTCTime).Nanoseconds =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    (pMTData->UTCTime).Year =
         *(ushort *)((long)&uStack_824 + lVar3) << 8 | *(ushort *)((long)&uStack_824 + lVar3) >> 8;
    (pMTData->UTCTime).Month = auStack_822[lVar3];
    (pMTData->UTCTime).Day = auStack_822[lVar3 + 1];
    (pMTData->UTCTime).Hour = auStack_822[lVar3 + 2];
    (pMTData->UTCTime).Minute = auStack_822[lVar3 + 3];
    (pMTData->UTCTime).Seconds = auStack_822[lVar3 + 4];
    (pMTData->UTCTime).Valid = auStack_822[lVar3 + 5];
  }
  memcpy(&pMT->LastMTData,pMTData,0x130);
  return 0;
}

Assistant:

inline int GetLatestDataMT(MT* pMT, MTDATA* pMTData)
{
	unsigned char databuf[MAX_NB_BYTES_MT];
	int nbdatabytes = 0;
	int offset = 0;
	uShort_MT us;
	uInt_MT ul;
	double roll = 0, pitch = 0, yaw = 0;

	// Warning : coordinate system might not be the same between legacy and normal modes!

	if (!pMT->bLegacyMode) return GetLatestData2MT(pMT, pMTData);

	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	if (GetLatestMTMessageMT(pMT, ADDR_MT, MTDATA_MID, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		return EXIT_FAILURE;	
	}

	// Analyze data.

	memset(pMTData, 0, sizeof(MTDATA));

	if (pMT->OutputMode & RAW_BIT)
	{
		// Un-calibrated RAW inertial data output mode.
		offset += 20;
	}

	if (pMT->OutputMode & GPS_PVT_BIT)
	{
		// GPS PVT data output mode.
		offset += 44;
	}

	if (pMT->OutputMode & TEMPERATURE_BIT)
	{
		// Temperature data output mode.
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->temp);
	}

	if (pMT->OutputMode & CALIBRATED_BIT)
	{
		// Calibrated data output mode.
		if ((pMT->OutputSettings & ACCELERATION) == 0)
		{
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->accX);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->accY);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->accZ);
		}
		if ((pMT->OutputSettings & RATE_OF_TURN) == 0)
		{
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->gyrX);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->gyrY);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->gyrZ);
		}
		if ((pMT->OutputSettings & MAGNETOMETER) == 0)
		{
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->magX);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->magY);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->magZ);
		}
	}

	if (pMT->OutputMode & ORIENTATION_BIT)
	{
		switch (pMT->OutputSettings & ORIENTATION_MODE_MASK)
		{
		case EULER_ANGLES:
			// Orientation data output mode - Euler angles.
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->roll);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->pitch);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->yaw);
			roll = pMTData->roll*M_PI/180.0;
			pitch = pMTData->pitch*M_PI/180.0;
			yaw = pMTData->yaw*M_PI/180.0;
			break;
		case MATRIX:
			// Orientation data output mode - Matrix.
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->a);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->b);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->c);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->d);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->e);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->f);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->g);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->h);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->i);
			roll = atan2(pMTData->f,pMTData->i);
			pitch = -asin(constrain(pMTData->c, -1, 1)); // Attempt to avoid potential NAN...
			yaw = atan2(pMTData->b,pMTData->a);
			
			// If raw Euler angles were not sent, ensure that they would still be in the log file.
			pMTData->roll = roll*180.0/M_PI;
			pMTData->pitch = pitch*180.0/M_PI;
			pMTData->yaw = yaw*180.0/M_PI;
			break;
		default:
			// Orientation data output mode - Quaternion.
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->q0);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->q1);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->q2);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->q3);
			quaternion2euler(pMTData->q0, pMTData->q1, pMTData->q2, pMTData->q3, &roll, &pitch, &yaw);
			
			// If raw Euler angles were not sent, ensure that they would still be in the log file.
			pMTData->roll = roll*180.0/M_PI;
			pMTData->pitch = pitch*180.0/M_PI;
			pMTData->yaw = yaw*180.0/M_PI;
			break;
		}

		// Apply corrections (magnetic, orientation of the sensor w.r.t. coordinate system...).
		pMTData->Roll = fmod_2PI(roll+pMT->rollorientation+pMT->rollp1*cos(roll+pMT->rollp2));
		pMTData->Pitch = fmod_2PI(pitch+pMT->pitchorientation+pMT->pitchp1*cos(pitch+pMT->pitchp2));
		pMTData->Yaw = fmod_2PI(yaw+pMT->yaworientation+pMT->yawp1*cos(yaw+pMT->yawp2));
	}

	if (pMT->OutputMode & AUXILIARY_BIT)
	{
		// Auxiliary data output mode.
		if ((pMT->OutputSettings & ANALOG_1) == 0)
		{
			us.c[0] = databuf[1+offset];
			us.c[1] = databuf[0+offset];
			pMTData->Ain_1 = us.v;
			offset += 2;
		}
		if ((pMT->OutputSettings & ANALOG_2) == 0)
		{
			us.c[0] = databuf[1+offset];
			us.c[1] = databuf[0+offset];
			pMTData->Ain_2 = us.v;
			offset += 2;
		}
	}

	if (pMT->OutputMode & POSITION_BIT)
	{
		// Position data output mode - LLA.
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->Lat);
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->Long);
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->Alt);
	}

	if (pMT->OutputMode & VELOCITY_BIT)
	{
		// Velocity data output mode - VelXYZ.
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->Vel_X);
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->Vel_Y);
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->Vel_Z);
	}

	if (pMT->OutputMode & STATUS_BIT)
	{
		// Status (1 byte).
		pMTData->Status = databuf[offset];
		offset += 1;
	}

	if (pMT->OutputSettings & SAMPLE_COUNTER)
	{
		// Sample counter (2 bytes).
		us.c[0] = databuf[1+offset];
		us.c[1] = databuf[0+offset];
		pMTData->TS = us.v;
		offset += 2;
	}

	if (pMT->OutputSettings & UTC_TIME)
	{
		// UTC Time (12 bytes).
		ul.c[0] = databuf[3+offset];
		ul.c[1] = databuf[2+offset];
		ul.c[2] = databuf[1+offset];
		ul.c[3] = databuf[0+offset];
		pMTData->UTCTime.Nanoseconds = ul.v;
		offset += 4;
		us.c[0] = databuf[1+offset];
		us.c[1] = databuf[0+offset];
		pMTData->UTCTime.Year = us.v;
		offset += 2;
		pMTData->UTCTime.Month = databuf[offset];
		offset += 1;
		pMTData->UTCTime.Day = databuf[offset];
		offset += 1;
		pMTData->UTCTime.Hour = databuf[offset];
		offset += 1;
		pMTData->UTCTime.Minute = databuf[offset];
		offset += 1;
		pMTData->UTCTime.Seconds = databuf[offset];
		offset += 1;
		pMTData->UTCTime.Valid = databuf[offset];
		offset += 1;
	}

	pMT->LastMTData = *pMTData;

	return EXIT_SUCCESS;
}